

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

shared_ptr<wallet::CWallet> wallet::GetDefaultWallet(WalletContext *context,size_t *count)

{
  size_type sVar1;
  size_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  Mutex *in_stack_ffffffffffffffb8;
  element_type *this;
  element_type *pszFile;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pszFile = in_RDI;
  MaybeCheckNotHeld(in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(char *)pszFile,
             (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  sVar1 = std::
          vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
          ::size((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  *)in_stack_ffffffffffffffb8);
  *in_RDX = sVar1;
  if (*in_RDX == 1) {
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    operator[]((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                *)this,(size_type)in_RDI);
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffffb8,
               (shared_ptr<wallet::CWallet> *)0x1996d7);
  }
  else {
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffffb8,(nullptr_t)0x1996e7);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28) == this_00) {
    sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<wallet::CWallet>)
           sVar2.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> GetDefaultWallet(WalletContext& context, size_t& count)
{
    LOCK(context.wallets_mutex);
    count = context.wallets.size();
    return count == 1 ? context.wallets[0] : nullptr;
}